

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter1.cpp
# Opt level: O1

void __thiscall UIContext::Detail::ActivateContext(Detail *this)

{
  ImGuiContext *pIVar1;
  ImGuiContext *pIVar2;
  long lVar3;
  int *piVar4;
  int *piVar5;
  byte bVar6;
  
  bVar6 = 0;
  pIVar2 = ImGui::GetCurrentContext();
  if (pIVar2 != this->_context) {
    if (pIVar2 != (ImGuiContext *)0x0) {
      memcpy(&this->_context->Style,&pIVar2->Style,0x3a0);
      piVar4 = (pIVar2->IO).KeyMap;
      piVar5 = (this->_context->IO).KeyMap;
      for (lVar3 = 0x15; lVar3 != 0; lVar3 = lVar3 + -1) {
        *piVar5 = *piVar4;
        piVar4 = piVar4 + (ulong)bVar6 * -2 + 1;
        piVar5 = piVar5 + (ulong)bVar6 * -2 + 1;
      }
      pIVar1 = this->_context;
      (pIVar1->IO).IniFilename = (pIVar2->IO).IniFilename;
      (pIVar1->IO).RenderDrawListsFn = (pIVar2->IO).RenderDrawListsFn;
      pIVar1->Initialized = pIVar2->Initialized;
    }
    ImGui::SetCurrentContext(this->_context);
    return;
  }
  return;
}

Assistant:

void ActivateContext()
    {
        ImGuiContext* prevContext = ImGui::GetCurrentContext();
        if (prevContext == _context)
            return;

        if (prevContext != nullptr)
        {
            std::memcpy(&_context->Style, &prevContext->Style, sizeof(ImGuiStyle));
            std::memcpy(&_context->IO.KeyMap, &prevContext->IO.KeyMap, sizeof(prevContext->IO.KeyMap));
            //std::memcpy(&_context->MouseCursorData, &prevContext->MouseCursorData, sizeof(_context->MouseCursorData));
            _context->IO.IniFilename = prevContext->IO.IniFilename;
            _context->IO.RenderDrawListsFn = prevContext->IO.RenderDrawListsFn;
            _context->Initialized = prevContext->Initialized;
        }

        ImGui::SetCurrentContext(_context);
    }